

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# remote_server.cpp
# Opt level: O2

void PrepareResponseForGet<unsigned_char>
               (CMConnection conn,Remote_evpath_state *ev_state,GetRequestMsg *GetMsg,
               string *VarName,DataType TypeOfVar,AnonADIOSFile *f)

{
  Variable *pVVar1;
  GetRequestMsg p_Var2;
  ostream *poVar3;
  char *pcVar4;
  int i;
  long lVar5;
  long lVar6;
  CMFormat *__args_1;
  bool local_b9;
  AnonADIOSFile *local_b8;
  Remote_evpath_state *local_b0;
  thread local_a8;
  string *local_a0;
  uchar *RawData;
  size_t readSize;
  AnonADIOSFile *f_local;
  CMConnection conn_local;
  Box<Dims> b;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_48;
  
  local_b0 = ev_state;
  f_local = f;
  conn_local = conn;
  pVVar1 = adios2::core::IO::InquireVariable<unsigned_char>((string *)f->m_io);
  if (f->m_mode == RemoteOpenRandomAccess) {
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)(*GetMsg)->Step;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)(*GetMsg)->StepCount;
    adios2::core::VariableBase::SetStepSelection((pair *)pVVar1);
  }
  p_Var2 = *GetMsg;
  if (p_Var2->BlockID != -1) {
    adios2::core::VariableBase::SetBlockSelection((ulong)pVVar1);
    p_Var2 = *GetMsg;
  }
  if (p_Var2->Start != (size_t *)0x0) {
    b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    b.second.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8 = f;
    local_a0 = VarName;
    if (p_Var2->Count != (size_t *)0x0) {
      lVar6 = 0;
      for (lVar5 = 0; lVar5 < p_Var2->DimCount; lVar5 = lVar5 + 1) {
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&b.first,(value_type_conflict1 *)((long)p_Var2->Start + lVar6));
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                  (&b.second,(value_type_conflict1 *)((long)(*GetMsg)->Count + lVar6));
        p_Var2 = *GetMsg;
        lVar6 = lVar6 + 8;
      }
    }
    adios2::core::VariableBase::SetSelection((pair *)pVVar1);
    std::
    pair<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
    ::~pair(&b);
    f = local_b8;
    VarName = local_a0;
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Reading var ");
  poVar3 = std::operator<<(poVar3,(string *)VarName);
  poVar3 = std::operator<<(poVar3," with ");
  pcVar4 = "relative";
  if ((*GetMsg)->Relative == '\0') {
    pcVar4 = "absolute";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::operator<<(poVar3," error ");
  poVar3 = std::ostream::_M_insert<double>((*GetMsg)->Error);
  std::operator<<(poVar3," in norm ");
  poVar3 = std::ostream::_M_insert<double>((*GetMsg)->Norm);
  std::endl<char,std::char_traits<char>>(poVar3);
  readSize = adios2::core::Variable<unsigned_char>::SelectionSize();
  RawData = (uchar *)malloc(readSize);
  adios2::core::Engine::Get<unsigned_char>((Variable *)f->m_engine,(uchar *)pVVar1,(Mode)RawData);
  WaitForAvailableThread();
  p_Var2 = *GetMsg;
  b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)p_Var2->Error;
  b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)p_Var2->Norm;
  b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)CONCAT71(b.first.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage._1_7_,
                         p_Var2->Relative != '\0');
  __args_1 = &local_b0->ReadResponseFormat;
  local_b0 = (Remote_evpath_state *)&p_Var2->Dest;
  local_b8 = (AnonADIOSFile *)(pVVar1 + 8);
  adios2::core::Variable<unsigned_char>::Count();
  local_b9 = *(int *)(pVVar1 + 0x50) == 0;
  std::thread::
  thread<void(&)(_CMConnection*,_CMFormat*,AnonADIOSFile*,unsigned_long,unsigned_char*,void*,int,adios2::Accuracy,std::__cxx11::string,adios2::DataType,unsigned_long,unsigned_long,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>,unsigned_long,bool),_CMConnection*&,_CMFormat*&,AnonADIOSFile*&,unsigned_long&,unsigned_char*&,void*&,int&,adios2::Accuracy&,std::__cxx11::string_const&,adios2::DataType_const&,unsigned_long&,unsigned_long&,std::vector<unsigned_long,std::allocator<unsigned_long>>,std::vector<unsigned_long,std::allocator<unsigned_long>>&,unsigned_long&,bool,void>
            (&local_a8,ReturnResponseThread<unsigned_char>,&conn_local,__args_1,&f_local,&readSize,
             &RawData,&local_b0->cm,&p_Var2->GetResponseCondition,(Accuracy *)&b,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8,
             (DataType *)(pVVar1 + 0x28),(unsigned_long *)(pVVar1 + 0x100),
             (unsigned_long *)(pVVar1 + 0x108),
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_48,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(pVVar1 + 0x70),
             (unsigned_long *)(pVVar1 + 0x48),&local_b9);
  std::thread::detach();
  std::thread::~thread(&local_a8);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void PrepareResponseForGet(CMConnection conn, struct Remote_evpath_state *ev_state,
                           GetRequestMsg &GetMsg, std::string &VarName, adios2::DataType TypeOfVar,
                           AnonADIOSFile *f)
{
    // This part cannot be threaded as ADIOS InquireVariable/Get are not thread-safe
    Variable<T> *var = f->m_io->InquireVariable<T>(VarName);
    if (f->m_mode == RemoteOpenRandomAccess)
        var->SetStepSelection({GetMsg->Step, GetMsg->StepCount});
    if (GetMsg->BlockID != -1)
        var->SetBlockSelection(GetMsg->BlockID);
    if (GetMsg->Start)
    {
        Box<Dims> b;
        if (GetMsg->Count)
        {
            for (int i = 0; i < GetMsg->DimCount; i++)
            {
                b.first.push_back(GetMsg->Start[i]);
                b.second.push_back(GetMsg->Count[i]);
            }
        }
        var->SetSelection(b);
    }
    std::cout << "Reading var " << VarName << " with "
              << (GetMsg->Relative ? "relative" : "absolute") << " error " << GetMsg->Error
              << " in norm " << GetMsg->Norm << std::endl;
    size_t readSize = var->SelectionSize() * sizeof(T);
    T *RawData = (T *)malloc(readSize);
    f->m_engine->Get(*var, RawData, Mode::Sync);

    WaitForAvailableThread(); /* blocking here until we can launch a thread */

    // Handle returning data in a separate thread so that we can serve another read operation in the
    // meantime. Compress data if possible and if requested.
    // Note: Can't pass Variable object to thread as other response will modify its content
    Accuracy acc = {GetMsg->Error, GetMsg->Norm, (bool)GetMsg->Relative};
    std::thread{ReturnResponseThread<T>,
                conn,
                ev_state->ReadResponseFormat,
                f,
                readSize,
                RawData,
                GetMsg->Dest,
                GetMsg->GetResponseCondition,
                acc,
                var->m_Name,
                var->m_Type,
                var->m_StepsStart,
                var->m_StepsCount,
                var->Count(), // function, not m_Count is correct for block selections
                var->m_Start,
                var->m_BlockID,
                (var->m_SelectionType == SelectionType::BoundingBox)}
        .detach();
    return;
}